

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

VRPoint3 * MinVR::operator*(VRMatrix4 *m,VRPoint3 *p)

{
  VRPoint3 *in_RDX;
  VRMatrix4 *in_RSI;
  VRPoint3 *in_RDI;
  float zz;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float winv;
  
  zz = VRPoint3::operator[](in_RDX,0);
  fVar1 = VRMatrix4::operator()(in_RSI,3,0);
  fVar2 = VRPoint3::operator[](in_RDX,1);
  fVar3 = VRMatrix4::operator()(in_RSI,3,1);
  fVar1 = zz * fVar1 + fVar2 * fVar3;
  fVar2 = VRPoint3::operator[](in_RDX,2);
  fVar3 = VRMatrix4::operator()(in_RSI,3,2);
  fVar3 = fVar2 * fVar3 + fVar1;
  VRMatrix4::operator()(in_RSI,3,3);
  VRPoint3::operator[](in_RDX,0);
  VRMatrix4::operator()(in_RSI,0,0);
  fVar4 = VRPoint3::operator[](in_RDX,1);
  VRMatrix4::operator()(in_RSI,0,1);
  VRPoint3::operator[](in_RDX,2);
  VRMatrix4::operator()(in_RSI,0,2);
  VRMatrix4::operator()(in_RSI,0,3);
  VRPoint3::operator[](in_RDX,0);
  VRMatrix4::operator()(in_RSI,1,0);
  VRPoint3::operator[](in_RDX,1);
  VRMatrix4::operator()(in_RSI,1,1);
  VRPoint3::operator[](in_RDX,2);
  VRMatrix4::operator()(in_RSI,1,2);
  VRMatrix4::operator()(in_RSI,1,3);
  VRPoint3::operator[](in_RDX,0);
  VRMatrix4::operator()(in_RSI,2,0);
  VRPoint3::operator[](in_RDX,1);
  VRMatrix4::operator()(in_RSI,2,1);
  VRPoint3::operator[](in_RDX,2);
  VRMatrix4::operator()(in_RSI,2,2);
  VRMatrix4::operator()(in_RSI,2,3);
  VRPoint3::VRPoint3((VRPoint3 *)CONCAT44(fVar4,fVar3),fVar2,fVar1,zz);
  return in_RDI;
}

Assistant:

VRPoint3 operator*(const VRMatrix4& m, const VRPoint3& p) {
	// For our points, p[3]=1 and we don't even bother storing p[3], so need to homogenize
	// by dividing by w before returning the new point.
    const float winv = 1 / (p[0] * m(3,0) + p[1] * m(3,1) + p[2] * m(3,2) + 1.0f * m(3,3));
    return VRPoint3(winv * (p[0] * m(0,0) + p[1] * m(0,1) + p[2] * m(0,2) + 1.0f * m(0,3)),
                    winv * (p[0] * m(1,0) + p[1] * m(1,1) + p[2] * m(1,2) + 1.0f * m(1,3)),
                    winv * (p[0] * m(2,0) + p[1] * m(2,1) + p[2] * m(2,2) + 1.0f * m(2,3)));

}